

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# element.cpp
# Opt level: O3

int __thiscall IntElemBoundsImp<0,_4,_0>::checkSatisfied(IntElemBoundsImp<0,_4,_0> *this)

{
  char cVar1;
  int iVar2;
  IntVar *pIVar3;
  int iVar4;
  int *pt;
  Tchar *pTVar5;
  TrailElem local_20;
  
  iVar4 = 1;
  if ((this->super_Propagator).satisfied.v == '\0') {
    cVar1 = sat.assigns.data[(uint)(this->b).v];
    iVar4 = 3;
    if ((cVar1 != '\0') &&
       (((short)(char)((int)cVar1 + (((int)(short)cVar1 + 1U & 0xffff) >> 0xf) + 1 >> 1) ==
         (ushort)(this->b).s ||
        (((pIVar3 = (this->x).var, iVar2 = (pIVar3->min).v, iVar2 == (pIVar3->max).v &&
          (pIVar3 = (this->y).var, (pIVar3->min).v == (pIVar3->max).v)) &&
         (pIVar3 = (this->a).data[(uint)(iVar2 + (this->x).b)].var,
         (pIVar3->min).v == (pIVar3->max).v)))))) {
      pTVar5 = &(this->super_Propagator).satisfied;
      local_20.x = 0;
      local_20.sz = 1;
      local_20.pt = (int *)pTVar5;
      vec<TrailElem>::push(&engine.trail,&local_20);
      pTVar5->v = '\x01';
    }
  }
  return iVar4;
}

Assistant:

int checkSatisfied() override {
		if (satisfied) {
			return 1;
		}
		if ((b.isFixed() && (b.getVal() == 0)) ||
				(b.isFixed() && x.isFixed() && y.isFixed() && a[static_cast<int>(x.getVal())].isFixed())) {
			satisfied = true;
		}
		return 3;
	}